

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int readSuperJournal(sqlite3_file *pJrnl,char *zSuper,u32 nSuper)

{
  u32 uVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  u32 len;
  i64 szJ;
  uchar aMagic [8];
  u32 local_40;
  u32 local_3c;
  long local_38;
  long local_30;
  
  *zSuper = '\0';
  iVar2 = (*pJrnl->pMethods->xFileSize)(pJrnl,&local_38);
  if ((0xf < local_38 && iVar2 == 0) &&
     (iVar2 = read32bits(pJrnl,local_38 + -0x10,&local_40), uVar1 = local_40, iVar2 == 0)) {
    uVar4 = (ulong)local_40;
    iVar2 = 0;
    if (((local_40 < nSuper) &&
        (((iVar2 = 0, uVar4 != 0 && (long)uVar4 <= local_38 + -0x10 &&
          (iVar2 = read32bits(pJrnl,local_38 + -0xc,&local_3c), iVar2 == 0)) &&
         (iVar2 = (*pJrnl->pMethods->xRead)(pJrnl,&local_30,8,local_38 + -8), iVar2 == 0)))) &&
       ((iVar2 = 0, local_30 == -0x289c5edf06fa2a27 &&
        (iVar2 = (*pJrnl->pMethods->xRead)(pJrnl,zSuper,uVar1,(local_38 - uVar4) + -0x10),
        iVar2 == 0)))) {
      if (uVar4 != 0) {
        uVar3 = 0;
        do {
          local_3c = local_3c - (int)zSuper[uVar3];
          uVar3 = uVar3 + 1;
        } while (uVar4 != uVar3);
      }
      if (local_3c != 0) {
        local_40 = 0;
      }
      iVar2 = 0;
      zSuper[local_40] = '\0';
      zSuper[local_40 + 1] = '\0';
    }
  }
  return iVar2;
}

Assistant:

static int readSuperJournal(sqlite3_file *pJrnl, char *zSuper, u32 nSuper){
  int rc;                    /* Return code */
  u32 len;                   /* Length in bytes of super-journal name */
  i64 szJ;                   /* Total size in bytes of journal file pJrnl */
  u32 cksum;                 /* MJ checksum value read from journal */
  u32 u;                     /* Unsigned loop counter */
  unsigned char aMagic[8];   /* A buffer to hold the magic header */
  zSuper[0] = '\0';

  if( SQLITE_OK!=(rc = sqlite3OsFileSize(pJrnl, &szJ))
   || szJ<16
   || SQLITE_OK!=(rc = read32bits(pJrnl, szJ-16, &len))
   || len>=nSuper
   || len>szJ-16
   || len==0
   || SQLITE_OK!=(rc = read32bits(pJrnl, szJ-12, &cksum))
   || SQLITE_OK!=(rc = sqlite3OsRead(pJrnl, aMagic, 8, szJ-8))
   || memcmp(aMagic, aJournalMagic, 8)
   || SQLITE_OK!=(rc = sqlite3OsRead(pJrnl, zSuper, len, szJ-16-len))
  ){
    return rc;
  }

  /* See if the checksum matches the super-journal name */
  for(u=0; u<len; u++){
    cksum -= zSuper[u];
  }
  if( cksum ){
    /* If the checksum doesn't add up, then one or more of the disk sectors
    ** containing the super-journal filename is corrupted. This means
    ** definitely roll back, so just return SQLITE_OK and report a (nul)
    ** super-journal filename.
    */
    len = 0;
  }
  zSuper[len] = '\0';
  zSuper[len+1] = '\0';

  return SQLITE_OK;
}